

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O3

Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::throwExceptionRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  SegmentBuilder *local_90;
  CapTableBuilder *pCStack_88;
  WirePointer *local_80;
  Disposer *local_78;
  RequestHook *pRStack_70;
  StructBuilder local_68;
  char local_40 [8];
  uint64_t local_38;
  undefined8 uStack_30;
  PointerBuilder local_28;
  
  local_40[0] = (sizeHint->ptr).isSet;
  if ((bool)local_40[0] != false) {
    local_38 = (sizeHint->ptr).field_1.value.wordCount;
    uStack_30 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  (**(code **)**(undefined8 **)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)))
            (&local_90,*(undefined8 **)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)),
             0xddc70bf9784133cf,0xe,local_40,1);
  local_28.pointer = local_80;
  local_28.segment = local_90;
  local_28.capTable = pCStack_88;
  ::capnp::_::PointerBuilder::getStruct(&local_68,&local_28,(StructSize)0x0,(word *)0x0);
  (__return_storage_ptr__->super_Builder)._builder.dataSize = local_68.dataSize;
  (__return_storage_ptr__->super_Builder)._builder.pointerCount = local_68.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->super_Builder)._builder.field_0x26 = local_68._38_2_;
  (__return_storage_ptr__->super_Builder)._builder.data = local_68.data;
  (__return_storage_ptr__->super_Builder)._builder.pointers = local_68.pointers;
  (__return_storage_ptr__->super_Builder)._builder.segment = local_68.segment;
  (__return_storage_ptr__->super_Builder)._builder.capTable = local_68.capTable;
  (__return_storage_ptr__->hook).disposer = local_78;
  (__return_storage_ptr__->hook).ptr = pRStack_70;
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
TestMoreStuff::Client::throwExceptionRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>(
      0xddc70bf9784133cfull, 14, sizeHint, {true});
}